

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dspsubrs.c
# Opt level: O3

void DSP_Cursor(LispPTR *args,int argnum)

{
  Set_XCursor((uint)(ushort)*args,(uint)(ushort)args[1]);
  return;
}

Assistant:

void DSP_Cursor(LispPTR *args, int argnum)
/* args[0] :	hot spot X
 * args[1] :	hot spot Y
 */
{
  extern int ScreenLocked;
  extern DLword *EmCursorX68K, *EmCursorY68K;
  extern int LastCursorX, LastCursorY;


#if defined(XWINDOW)
  /* For X-Windows, set the cursor to the given location. */
  Set_XCursor((int)(args[0] & 0xFFFF), (int)(args[1] & 0xFFFF));
#elif defined(SDL)
  sdl_setCursor((int)(args[0] & 0xFFFF), (int)(args[1] & 0xFFFF));
#endif /* XWINDOW */
}